

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

LY_ERR ly_value_validate(ly_ctx *ctx,lysc_node *node,char *value,size_t value_len,
                        LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints)

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  ly_ctx *plVar4;
  ly_err_item *err;
  lyd_value storage;
  
  if ((node == (lysc_node *)0x0) || ((node->nodetype & 0xc) == 0)) {
    LVar3 = LY_EINVAL;
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","ly_value_validate");
  }
  else {
    plVar1 = node[1].parent;
    plVar4 = ctx;
    if (ctx == (ly_ctx *)0x0) {
      plVar4 = node->module->ctx;
    }
    LVar2 = (*(code *)plVar1->parent->module)(plVar4);
    LVar3 = LY_SUCCESS;
    if (LVar2 != LY_EINCOMPLETE) {
      LVar3 = LVar2;
    }
    if (LVar3 == LY_SUCCESS) {
      if (ctx == (ly_ctx *)0x0) {
        ctx = node->module->ctx;
      }
      (*(code *)plVar1->parent->ref)(ctx,&storage);
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
ly_value_validate(const struct ly_ctx *ctx, const struct lysc_node *node, const char *value, size_t value_len,
        LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints)
{
    LY_ERR rc = LY_SUCCESS;
    struct ly_err_item *err = NULL;
    struct lyd_value storage;
    struct lysc_type *type;

    LY_CHECK_ARG_RET(ctx, node, LY_EINVAL);

    if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGARG(ctx, node);
        return LY_EINVAL;
    }

    type = ((struct lysc_node_leaf *)node)->type;
    rc = type->plugin->store(ctx ? ctx : node->module->ctx, type, value, value_len, 0, format, prefix_data, hints, node,
            &storage, NULL, &err);
    if (rc == LY_EINCOMPLETE) {
        /* actually success since we do not provide the context tree and call validation with
         * LY_TYPE_OPTS_INCOMPLETE_DATA */
        rc = LY_SUCCESS;
    } else if (rc && err) {
        if (ctx) {
            /* log only in case the ctx was provided as input parameter */
            ly_err_print_build_path(ctx, NULL, node, err);
        }
        ly_err_free(err);
    }

    if (!rc) {
        type->plugin->free(ctx ? ctx : node->module->ctx, &storage);
    }
    return rc;
}